

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O1

void __thiscall Generation::Generation(Generation *this,string *inPath,int inUmask,bool inIsToken)

{
  MutexFactory *this_00;
  Mutex *pMVar1;
  
  this->_vptr_Generation = (_func_int **)&PTR__Generation_0019fa20;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->path);
  this->umask = inUmask;
  this->isToken = inIsToken;
  this->pendingUpdate = false;
  this->currentValue = 0;
  this->genMutex = (Mutex *)0x0;
  if (inIsToken) {
    this_00 = MutexFactory::i();
    pMVar1 = MutexFactory::getMutex(this_00);
    this->genMutex = pMVar1;
    if (pMVar1 != (Mutex *)0x0) {
      commit(this);
    }
  }
  return;
}

Assistant:

Generation::Generation(const std::string inPath, int inUmask, bool inIsToken)
{
	path = inPath;
	umask = inUmask;
	isToken = inIsToken;
	pendingUpdate = false;
	currentValue = 0;
	genMutex = NULL;

	if (isToken)
	{
		genMutex = MutexFactory::i()->getMutex();

		if (genMutex != NULL)
		{
			commit();
		}
	}
}